

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::io::anon_unknown_0::CordOutputStreamTest_ProperHintCreatesSingleFlatCord_Test::
~CordOutputStreamTest_ProperHintCreatesSingleFlatCord_Test
          (CordOutputStreamTest_ProperHintCreatesSingleFlatCord_Test *this)

{
  CordOutputStreamTest_ProperHintCreatesSingleFlatCord_Test *this_local;
  
  ~CordOutputStreamTest_ProperHintCreatesSingleFlatCord_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(CordOutputStreamTest, ProperHintCreatesSingleFlatCord) {
  CordOutputStream output(2000);
  void* data;
  int size;
  ASSERT_TRUE(output.Next(&data, &size));
  ASSERT_EQ(size, 2000);
  memset(data, 'a', 2000);

  absl::Cord cord = output.Consume();
  ASSERT_TRUE(cord.TryFlat());
  absl::string_view flat = *cord.TryFlat();
  EXPECT_EQ(flat, std::string(2000, 'a'));
}